

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithMemoryBuffer_Test::~TEST_MockExpectedCall_callWithMemoryBuffer_Test
          (TEST_MockExpectedCall_callWithMemoryBuffer_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithMemoryBuffer)
{
    const SimpleString paramName = "paramName";
    const unsigned char value[] = { 0x12, 0xFE, 0xA1 };
    call->withParameter(paramName, value, sizeof(value));
    STRCMP_EQUAL("const unsigned char*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getMemoryBuffer());
    LONGS_EQUAL(sizeof(value),  call->getInputParameter(paramName).getSize());
    STRCMP_CONTAINS("funcName -> const unsigned char* paramName: <Size = 3 | HexContents = 12 FE A1>", call->callToString().asCharString());
}